

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_sqr.c
# Opt level: O1

void bn_sqr_recursive(unsigned_long *r,unsigned_long *a,int n2,unsigned_long *t)

{
  ulong *puVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long *puVar7;
  unsigned_long *b;
  unsigned_long *ap;
  uint n;
  
  if (n2 == 8) {
    bn_sqr_comba8(r,a);
    return;
  }
  if (n2 != 4) {
    if (0xf < n2) {
      n = n2 / 2;
      b = a + n;
      iVar3 = bn_cmp_words(a,b,n);
      puVar7 = b;
      ap = a;
      if ((iVar3 < 1) && (puVar7 = a, ap = b, -1 < iVar3)) {
        bVar2 = false;
      }
      else {
        bn_sub_words(t,ap,puVar7,n);
        bVar2 = true;
      }
      puVar7 = t + (uint)(n2 * 2);
      uVar5 = (ulong)(uint)n2;
      if (bVar2) {
        bn_sqr_recursive(t + uVar5,t,n,puVar7);
      }
      else {
        memset(t + uVar5,0,uVar5 * 8);
      }
      bn_sqr_recursive(r,a,n,puVar7);
      bn_sqr_recursive(r + uVar5,b,n,puVar7);
      uVar4 = bn_add_words(t,r,r + uVar5,n2);
      puVar1 = t + uVar5;
      uVar5 = bn_sub_words(puVar1,t,puVar1,n2);
      uVar6 = bn_add_words(r + n,r + n,puVar1,n2);
      iVar3 = (int)uVar6 + ((int)uVar4 - (int)uVar5);
      if (iVar3 != 0) {
        puVar1 = r + (n + n2);
        uVar5 = *puVar1;
        *puVar1 = *puVar1 + (long)iVar3;
        if (CARRY8(uVar5,(long)iVar3)) {
          puVar7 = r + (n + n2);
          do {
            puVar7 = puVar7 + 1;
            *puVar7 = *puVar7 + 1;
          } while (*puVar7 == 0);
        }
      }
      return;
    }
    bn_sqr_normal(r,a,n2,t);
    return;
  }
  bn_sqr_comba4(r,a);
  return;
}

Assistant:

void bn_sqr_recursive(BN_ULONG *r, const BN_ULONG *a, int n2, BN_ULONG *t)
{
    int n = n2 / 2;
    int zero, c1;
    BN_ULONG ln, lo, *p;

    if (n2 == 4) {
# ifndef BN_SQR_COMBA
        bn_sqr_normal(r, a, 4, t);
# else
        bn_sqr_comba4(r, a);
# endif
        return;
    } else if (n2 == 8) {
# ifndef BN_SQR_COMBA
        bn_sqr_normal(r, a, 8, t);
# else
        bn_sqr_comba8(r, a);
# endif
        return;
    }
    if (n2 < BN_SQR_RECURSIVE_SIZE_NORMAL) {
        bn_sqr_normal(r, a, n2, t);
        return;
    }
    /* r=(a[0]-a[1])*(a[1]-a[0]) */
    c1 = bn_cmp_words(a, &(a[n]), n);
    zero = 0;
    if (c1 > 0)
        bn_sub_words(t, a, &(a[n]), n);
    else if (c1 < 0)
        bn_sub_words(t, &(a[n]), a, n);
    else
        zero = 1;

    /* The result will always be negative unless it is zero */
    p = &(t[n2 * 2]);

    if (!zero)
        bn_sqr_recursive(&(t[n2]), t, n, p);
    else
        memset(&t[n2], 0, sizeof(*t) * n2);
    bn_sqr_recursive(r, a, n, p);
    bn_sqr_recursive(&(r[n2]), &(a[n]), n, p);

    /*-
     * t[32] holds (a[0]-a[1])*(a[1]-a[0]), it is negative or zero
     * r[10] holds (a[0]*b[0])
     * r[32] holds (b[1]*b[1])
     */

    c1 = (int)(bn_add_words(t, r, &(r[n2]), n2));

    /* t[32] is negative */
    c1 -= (int)(bn_sub_words(&(t[n2]), t, &(t[n2]), n2));

    /*-
     * t[32] holds (a[0]-a[1])*(a[1]-a[0])+(a[0]*a[0])+(a[1]*a[1])
     * r[10] holds (a[0]*a[0])
     * r[32] holds (a[1]*a[1])
     * c1 holds the carry bits
     */
    c1 += (int)(bn_add_words(&(r[n]), &(r[n]), &(t[n2]), n2));
    if (c1) {
        p = &(r[n + n2]);
        lo = *p;
        ln = (lo + c1) & BN_MASK2;
        *p = ln;

        /*
         * The overflow will stop before we over write words we should not
         * overwrite
         */
        if (ln < (BN_ULONG)c1) {
            do {
                p++;
                lo = *p;
                ln = (lo + 1) & BN_MASK2;
                *p = ln;
            } while (ln == 0);
        }
    }
}